

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliY.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::PauliY<std::complex<float>_>::matrix(PauliY<std::complex<float>_> *this)

{
  complex<float> in_RCX;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  SquareMatrix<std::complex<float>_> SVar1;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20 [2];
  PauliY<std::complex<float>_> *this_local;
  
  this_local = this;
  std::complex<float>::complex(local_20,0.0,0.0);
  std::complex<float>::complex(&local_28,0.0,-1.0);
  std::complex<float>::complex(&local_30,0.0,1.0);
  std::complex<float>::complex(&local_38,0.0,0.0);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,in_RSI,m01,in_RCX,in_R8);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >(   0    , T(0,-1) ,
                                                  T(0,1) ,   0     ) ;
        }